

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O1

void text_subtitles::TextSubtitlesRender::addBorder
               (int borderWidth,uint8_t *data,int width,int height)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  uint8_t *puVar8;
  int *piVar9;
  
  if (0 < borderWidth) {
    iVar1 = height + -1;
    lVar6 = (long)width;
    iVar5 = 0;
    do {
      if (0 < height) {
        iVar3 = 0;
        puVar8 = data;
        do {
          if (0 < width) {
            lVar7 = 0;
            lVar2 = 0;
            do {
              if ((*(int *)(puVar8 + lVar2 * 4) != 0) && (*(int *)(puVar8 + lVar2 * 4) != 0x10101))
              {
                if ((int)lVar2 != 0) {
                  if (*(int *)(puVar8 + lVar2 * 4 + -4) == 0) {
                    builtin_memcpy(puVar8 + lVar2 * 4 + -4,"\x01\x01\x01",4);
                  }
                  if ((iVar3 != 0) && (*(int *)(puVar8 + lVar2 * 4 + lVar6 * -4 + -4) == 0)) {
                    builtin_memcpy(puVar8 + lVar2 * 4 + lVar6 * -4 + -4,"\x01\x01\x01",4);
                  }
                  if ((iVar3 < iVar1) && (*(int *)(puVar8 + lVar2 * 4 + lVar6 * 4 + -4) == 0)) {
                    builtin_memcpy(puVar8 + lVar2 * 4 + lVar6 * 4 + -4,"\x01\x01\x01",4);
                  }
                }
                if ((iVar3 != 0) && (*(int *)(puVar8 + lVar2 * 4 + lVar6 * -4) == 0)) {
                  builtin_memcpy(puVar8 + lVar2 * 4 + lVar6 * -4,"\x01\x01\x01",4);
                }
                if ((iVar3 < iVar1) && (*(int *)(puVar8 + lVar2 * 4 + lVar6 * 4) == 0)) {
                  builtin_memcpy(puVar8 + lVar2 * 4 + lVar6 * 4,"\x01\x01\x01",4);
                }
                if ((int)lVar2 < width + -1) {
                  if (*(int *)(puVar8 + lVar2 * 4 + 4) == 0) {
                    builtin_memcpy(puVar8 + lVar2 * 4 + 4,"\x01\x01\x01",4);
                  }
                  if ((iVar3 != 0) && (*(int *)(puVar8 + lVar2 * 4 + lVar6 * -4 + 4) == 0)) {
                    builtin_memcpy(puVar8 + lVar2 * 4 + lVar6 * -4 + 4,"\x01\x01\x01",4);
                  }
                  if ((iVar3 < iVar1) && (*(int *)(puVar8 + lVar2 * 4 + lVar6 * 4 + 4) == 0)) {
                    builtin_memcpy(puVar8 + lVar2 * 4 + lVar6 * 4 + 4,"\x01\x01\x01",4);
                  }
                }
              }
              lVar2 = lVar2 + 1;
              lVar7 = lVar7 + -4;
            } while (width != (int)lVar2);
            puVar8 = puVar8 + -lVar7;
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 != height);
      }
      if (0 < height) {
        iVar3 = 0;
        piVar9 = (int *)data;
        do {
          iVar4 = width;
          if (0 < width) {
            do {
              if (*piVar9 == 0x10101) {
                *piVar9 = -0xfdfdfe;
              }
              piVar9 = piVar9 + 1;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          iVar3 = iVar3 + 1;
        } while (iVar3 != height);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != borderWidth);
  }
  return;
}

Assistant:

void TextSubtitlesRender::addBorder(const int borderWidth, uint8_t* data, const int width, const int height)
{
    // add black border
    for (int i = 0; i < borderWidth; ++i)
    {
        auto dst = reinterpret_cast<uint32_t*>(data);
        for (int y = 0; y < height; ++y)
        {
            for (int x = 0; x < width; ++x)
            {
                if (*dst != 0 && *dst != BORDER_COLOR_TMP)
                {
                    if (x > 0)
                    {
                        setBPoint(dst - 1);
                        if (y > 0)
                            setBPoint(dst - 1 - width);
                        if (y < height - 1)
                            setBPoint(dst - 1 + width);
                    }
                    if (y > 0)
                        setBPoint(dst - width);
                    if (y < height - 1)
                        setBPoint(dst + width);
                    if (x < width - 1)
                    {
                        setBPoint(dst + 1);
                        if (y > 0)
                            setBPoint(dst + 1 - width);
                        if (y < height - 1)
                            setBPoint(dst + 1 + width);
                    }
                }
                dst++;
            }
        }
        dst = reinterpret_cast<uint32_t*>(data);
        for (int y = 0; y < height; ++y)
            for (int x = 0; x < width; ++x)
            {
                if (*dst == BORDER_COLOR_TMP)
                    *dst = BORDER_COLOR;
                dst++;
            }
    }
}